

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<long_*>::TPZVec(TPZVec<long_*> *this,initializer_list<long_*> *list)

{
  ulong uVar1;
  iterator pplVar2;
  long **pplVar3;
  long lVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b630;
  this->fStore = (long **)0x0;
  uVar1 = list->_M_len;
  if (uVar1 != 0) {
    pplVar3 = (long **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->fStore = pplVar3;
    pplVar2 = list->_M_array;
    pplVar3 = this->fStore;
    lVar4 = 0;
    do {
      *(undefined8 *)((long)pplVar3 + lVar4) = *(undefined8 *)((long)pplVar2 + lVar4);
      lVar4 = lVar4 + 8;
    } while (uVar1 * 8 - lVar4 != 0);
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}